

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cDirectStateAccessProgramPipelinesTests.cpp
# Opt level: O0

IterateResult __thiscall
gl4cts::DirectStateAccess::ProgramPipelines::CreationTest::iterate(CreationTest *this)

{
  bool bVar1;
  bool bVar2;
  char cVar3;
  int iVar4;
  ContextType ctxType;
  ApiType requiredApiType;
  deUint32 dVar5;
  RenderContext *pRVar6;
  undefined4 extraout_var;
  ContextInfo *this_00;
  TestContext *pTVar8;
  TestLog *pTVar9;
  MessageBuilder *pMVar10;
  uint local_35c;
  undefined1 local_358 [4];
  GLuint i_2;
  uint local_1d4;
  undefined1 local_1d0 [4];
  GLuint i_1;
  uint local_50;
  GLuint i;
  int local_40 [2];
  GLuint program_pipelines_dsa [2];
  GLuint program_pipelines_legacy [2];
  bool is_error;
  bool is_ok;
  bool is_arb_direct_state_access;
  bool is_at_least_gl_45;
  Functions *gl;
  CreationTest *this_local;
  long lVar7;
  
  pRVar6 = deqp::Context::getRenderContext((this->super_TestCase).m_context);
  iVar4 = (*pRVar6->_vptr_RenderContext[3])();
  lVar7 = CONCAT44(extraout_var,iVar4);
  pRVar6 = deqp::Context::getRenderContext((this->super_TestCase).m_context);
  ctxType.super_ApiType.m_bits = (ApiType)(*pRVar6->_vptr_RenderContext[2])();
  requiredApiType = glu::ApiType::core(4,5);
  bVar1 = glu::contextSupports(ctxType,requiredApiType);
  this_00 = deqp::Context::getContextInfo((this->super_TestCase).m_context);
  bVar2 = glu::ContextInfo::isExtensionSupported(this_00,"GL_ARB_direct_state_access");
  if ((bVar1) || (bVar2)) {
    bVar1 = true;
    program_pipelines_dsa[0] = 0;
    program_pipelines_dsa[1] = 0;
    local_40[0] = 0;
    local_40[1] = 0;
    (**(code **)(lVar7 + 0x6d8))(2,program_pipelines_dsa);
    dVar5 = (**(code **)(lVar7 + 0x800))();
    glu::checkError(dVar5,"glGenProgramPipelines have failed",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessProgramPipelinesTests.cpp"
                    ,0x65);
    for (local_50 = 0; local_50 < 2; local_50 = local_50 + 1) {
      cVar3 = (**(code **)(lVar7 + 0xc98))(program_pipelines_dsa[local_50]);
      if (cVar3 != '\0') {
        bVar1 = false;
        pTVar8 = deqp::Context::getTestContext((this->super_TestCase).m_context);
        pTVar9 = tcu::TestContext::getLog(pTVar8);
        tcu::TestLog::operator<<
                  ((MessageBuilder *)local_1d0,pTVar9,(BeginMessageToken *)&tcu::TestLog::Message);
        pMVar10 = tcu::MessageBuilder::operator<<
                            ((MessageBuilder *)local_1d0,
                             (char (*) [84])
                             "GenProgramPipelines has created default objects, but it should create only a names."
                            );
        tcu::MessageBuilder::operator<<(pMVar10,(EndMessageToken *)&tcu::TestLog::EndMessage);
        tcu::MessageBuilder::~MessageBuilder((MessageBuilder *)local_1d0);
      }
    }
    (**(code **)(lVar7 + 0x3d0))(2,local_40);
    dVar5 = (**(code **)(lVar7 + 0x800))();
    glu::checkError(dVar5,"glCreateProgramPipelines have failed",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessProgramPipelinesTests.cpp"
                    ,0x77);
    for (local_1d4 = 0; local_1d4 < 2; local_1d4 = local_1d4 + 1) {
      cVar3 = (**(code **)(lVar7 + 0xc98))(program_pipelines_dsa[(ulong)local_1d4 - 2]);
      if (cVar3 == '\0') {
        bVar1 = false;
        pTVar8 = deqp::Context::getTestContext((this->super_TestCase).m_context);
        pTVar9 = tcu::TestContext::getLog(pTVar8);
        tcu::TestLog::operator<<
                  ((MessageBuilder *)local_358,pTVar9,(BeginMessageToken *)&tcu::TestLog::Message);
        pMVar10 = tcu::MessageBuilder::operator<<
                            ((MessageBuilder *)local_358,
                             (char (*) [56])
                             "CreateProgramPipelines has not created default objects.");
        tcu::MessageBuilder::operator<<(pMVar10,(EndMessageToken *)&tcu::TestLog::EndMessage);
        tcu::MessageBuilder::~MessageBuilder((MessageBuilder *)local_358);
      }
    }
    for (local_35c = 0; local_35c < 2; local_35c = local_35c + 1) {
      if (program_pipelines_dsa[local_35c] != 0) {
        (**(code **)(lVar7 + 0x450))(1);
        program_pipelines_dsa[local_35c] = 0;
      }
      if (program_pipelines_dsa[(ulong)local_35c - 2] != 0) {
        (**(code **)(lVar7 + 0x450))(1);
        program_pipelines_dsa[(ulong)local_35c - 2] = 0;
      }
    }
    if (bVar1) {
      tcu::TestContext::setTestResult
                ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,QP_TEST_RESULT_PASS,
                 "Pass");
    }
    else {
      tcu::TestContext::setTestResult
                ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,QP_TEST_RESULT_FAIL,
                 "Fail");
    }
  }
  else {
    tcu::TestContext::setTestResult
              ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,
               QP_TEST_RESULT_NOT_SUPPORTED,"Not Supported");
  }
  return STOP;
}

Assistant:

tcu::TestNode::IterateResult CreationTest::iterate()
{
	/* Shortcut for GL functionality */
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	/* Get context setup. */
	bool is_at_least_gl_45 = (glu::contextSupports(m_context.getRenderContext().getType(), glu::ApiType::core(4, 5)));
	bool is_arb_direct_state_access = m_context.getContextInfo().isExtensionSupported("GL_ARB_direct_state_access");

	if ((!is_at_least_gl_45) && (!is_arb_direct_state_access))
	{
		m_testCtx.setTestResult(QP_TEST_RESULT_NOT_SUPPORTED, "Not Supported");

		return STOP;
	}

	/* Running tests. */
	bool is_ok	= true;
	bool is_error = false;

	/* Program pipeline objects */
	static const glw::GLuint program_pipelines_count = 2;

	glw::GLuint program_pipelines_legacy[program_pipelines_count] = {};
	glw::GLuint program_pipelines_dsa[program_pipelines_count]	= {};

	try
	{
		/* Check legacy state creation. */
		gl.genProgramPipelines(program_pipelines_count, program_pipelines_legacy);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glGenProgramPipelines have failed");

		for (glw::GLuint i = 0; i < program_pipelines_count; ++i)
		{
			if (gl.isProgramPipeline(program_pipelines_legacy[i]))
			{
				is_ok = false;

				/* Log. */
				m_context.getTestContext().getLog()
					<< tcu::TestLog::Message
					<< "GenProgramPipelines has created default objects, but it should create only a names."
					<< tcu::TestLog::EndMessage;
			}
		}

		/* Check direct state creation. */
		gl.createProgramPipelines(program_pipelines_count, program_pipelines_dsa);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glCreateProgramPipelines have failed");

		for (glw::GLuint i = 0; i < program_pipelines_count; ++i)
		{
			if (!gl.isProgramPipeline(program_pipelines_dsa[i]))
			{
				is_ok = false;

				/* Log. */
				m_context.getTestContext().getLog() << tcu::TestLog::Message
													<< "CreateProgramPipelines has not created default objects."
													<< tcu::TestLog::EndMessage;
			}
		}
	}
	catch (...)
	{
		is_ok	= false;
		is_error = true;
	}

	/* Cleanup. */
	for (glw::GLuint i = 0; i < program_pipelines_count; ++i)
	{
		if (program_pipelines_legacy[i])
		{
			gl.deleteProgramPipelines(1, &program_pipelines_legacy[i]);

			program_pipelines_legacy[i] = 0;
		}

		if (program_pipelines_dsa[i])
		{
			gl.deleteProgramPipelines(1, &program_pipelines_dsa[i]);

			program_pipelines_dsa[i] = 0;
		}
	}

	/* Result's setup. */
	if (is_ok)
	{
		m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");
	}
	else
	{
		if (is_error)
		{
			m_testCtx.setTestResult(QP_TEST_RESULT_INTERNAL_ERROR, "Error");
		}
		else
		{
			m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Fail");
		}
	}

	return STOP;
}